

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_Fifteen.cpp
# Opt level: O0

void Fifteen::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Fifteen *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      pressTile((Fifteen *)_o);
      break;
    case 1:
      slotLoadGraphic((Fifteen *)_o);
      break;
    case 2:
      slotRemoveGraphic((Fifteen *)_o);
      break;
    case 3:
      slotSaveBoard((Fifteen *)_o);
      break;
    case 4:
      slotReadBoard((Fifteen *)_o);
      break;
    case 5:
      slotSettings((Fifteen *)_o);
      break;
    case 6:
      slotAbout((Fifteen *)_o);
      break;
    case 7:
      slotGenerateBoard((Fifteen *)_o);
      break;
    case 8:
      slotSolveBoard((Fifteen *)_o);
      break;
    case 9:
      slotUndoMove((Fifteen *)_o);
    }
  }
  return;
}

Assistant:

void Fifteen::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Fifteen *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->pressTile(); break;
        case 1: _t->slotLoadGraphic(); break;
        case 2: _t->slotRemoveGraphic(); break;
        case 3: _t->slotSaveBoard(); break;
        case 4: _t->slotReadBoard(); break;
        case 5: _t->slotSettings(); break;
        case 6: _t->slotAbout(); break;
        case 7: _t->slotGenerateBoard(); break;
        case 8: _t->slotSolveBoard(); break;
        case 9: _t->slotUndoMove(); break;
        default: ;
        }
    }
    (void)_a;
}